

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSolvmin.cpp
# Opt level: O3

bool __thiscall chrono::ChOptimizerGenetic::InitializePopulation(ChOptimizerGenetic *this)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  ChGenotype **ppCVar4;
  int iVar5;
  bool bVar6;
  long lVar7;
  ulong uVar8;
  undefined1 auVar9 [64];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 extraout_var [56];
  
  uVar3 = (*(this->super_ChOptimizer)._vptr_ChOptimizer[7])();
  ppCVar4 = this->population;
  if ((ppCVar4 == (ChGenotype **)0x0) ||
     (((*ppCVar4)->genes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
      m_rows != (long)(int)uVar3)) {
    bVar6 = false;
  }
  else {
    iVar5 = *(int *)&(this->super_ChOptimizer).field_0x144;
    bVar6 = true;
    if (0 < iVar5) {
      lVar7 = 0;
      do {
        ppCVar4[lVar7]->need_eval = true;
        if (0 < (int)uVar3) {
          uVar8 = 0;
          do {
            dVar1 = (this->super_ChOptimizer).xv_inf[uVar8];
            dVar2 = (this->super_ChOptimizer).xv_sup[uVar8];
            auVar9._0_8_ = ChRandom();
            auVar9._8_56_ = extraout_var;
            ppCVar4 = this->population;
            if ((ppCVar4[lVar7]->genes).
                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows <=
                (long)uVar8) {
              __assert_fail("index >= 0 && index < size()",
                            "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                            "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                           );
            }
            auVar11._8_8_ = 0;
            auVar11._0_8_ = dVar1;
            auVar10._8_8_ = 0;
            auVar10._0_8_ = dVar2 - dVar1;
            auVar10 = vfmadd213sd_fma(auVar10,auVar9._0_16_,auVar11);
            (ppCVar4[lVar7]->genes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
            m_storage.m_data[uVar8] = auVar10._0_8_;
            uVar8 = uVar8 + 1;
          } while (uVar3 != uVar8);
          iVar5 = *(int *)&(this->super_ChOptimizer).field_0x144;
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 < iVar5);
    }
  }
  return bVar6;
}

Assistant:

bool ChOptimizerGenetic::InitializePopulation() {
    int nv = GetNumOfVars();
    int mind;
    int varindex;
    double mvalue, a1, a2;

    if (population == NULL)
        return false;
    if (population[0]->genes.size() != nv)
        return false;

    for (mind = 0; mind < popsize; mind++) {
        varindex = 0;
        population[mind]->need_eval = true;
        for (varindex = 0; varindex < nv; varindex++) {
            a1 = xv_inf[varindex];  // the random value of each variable
            a2 = xv_sup[varindex];  // must lie within the max/min limits
            mvalue = a1 + (ChRandom() * (a2 - a1));
            population[mind]->genes(varindex) = mvalue;
        }
    }

    return true;
}